

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well.hpp
# Opt level: O1

result_type __thiscall
Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_Detail::M3<-18>,_Detail::M3<-14>,_Detail::M0,_Detail::M3<18>,_Detail::M3<-24>,_Detail::M3<5>,_Detail::M3<-1>,_Detail::M0,_Detail::NoTempering>
::operator()(Well<unsigned_int,_32UL,_19UL,_1UL,_16UL,_18UL,_13UL,_Detail::M3<_18>,_Detail::M3<_14>,_Detail::M0,_Detail::M3<18>,_Detail::M3<_24>,_Detail::M3<5>,_Detail::M3<_1>,_Detail::M0,_Detail::NoTempering>
             *this)

{
  ulong uVar1;
  size_t sVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  
  sVar2 = this->index_;
  uVar9 = sVar2 + 0x12;
  if (uVar9 < 0x26) {
    uVar5 = sVar2 - 1;
    if (uVar9 < 0x13) {
      uVar5 = uVar9;
    }
    uVar9 = sVar2 + 0x11;
    if (uVar9 < 0x26) {
      uVar4 = sVar2 - 2;
      if (uVar9 < 0x13) {
        uVar4 = uVar9;
      }
      uVar9 = sVar2 + 0x10;
      if ((uVar9 < 0x26) && (uVar1 = sVar2 + 0xd, uVar1 < 0x26)) {
        uVar6 = sVar2 - 3;
        if (uVar9 < 0x13) {
          uVar6 = uVar9;
        }
        uVar7 = this->state_[uVar6] << 0xe ^
                this->state_[sVar2] << 0x12 ^ this->state_[sVar2] ^ this->state_[uVar6];
        uVar3 = this->state_[uVar4] & 1 | this->state_[uVar5] & 0xfffffffe;
        uVar9 = sVar2 - 6;
        if (uVar1 < 0x13) {
          uVar9 = uVar1;
        }
        uVar8 = this->state_[uVar9] >> 0x12 ^ this->state_[uVar9];
        uVar3 = uVar3 ^ uVar7 ^ uVar7 >> 5 ^ uVar8 ^ uVar8 * 2 ^ uVar3 << 0x18;
        this->state_[sVar2] = uVar7 ^ uVar8;
        this->state_[uVar5] = uVar3;
        this->index_ = uVar5;
        return uVar3;
      }
    }
  }
  __assert_fail("value < 2 * r",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sehe[P]well-random/well.hpp"
                ,0x9e,
                "static T Detail::Modulo<unsigned long, 19>::calc(T, std::false_type) [UIntType = unsigned long, r = 19, T = unsigned long]"
               );
}

Assistant:

result_type operator()()
    {
        const UIntType upper_mask = ~0U << p;
        const UIntType lower_mask = ~upper_mask;

        // v[i,j] = state[(r-i+j) mod r]
        std::size_t i = index_;
        // Equivalent to r-i but allows to avoid negative values in the
        // following two expressions
        std::size_t j = i + r;
        std::size_t k = mod(j - 1); // [i,r-1]
        std::size_t l = mod(j - 2); // [i,r-2]

        std::size_t im1 = i + m1;
        std::size_t im2 = i + m2;
        std::size_t im3 = i + m3;

        UIntType z0, z1, z2, z3, z4;

        z0 = (state_[k] & upper_mask) | (state_[l] & lower_mask);
        z1 = T0::transform(state_[i]) ^
             T1::transform(state(im1));
        z2 = T2::transform(state(im2)) ^
             T3::transform(state(im3));
        z3 = z1 ^ z2;
        z4 = T4::transform(z0) ^ T5::transform(z1) ^
             T6::transform(z2) ^ T7::transform(z3);

        state_[i] = z3; // v[i+1,1]
        state_[k] = z4; // v[i+1,0]

        index_ = k;

        return Tempering::template apply<r>(z4, state_, im2);
    }